

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O2

void __thiscall
amrex::MLEBTensorOp::compCrossTerms(MLEBTensorOp *this,int amrlev,int mglev,MultiFab *mf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  FabType FVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  EBFArrayBoxFactory *this_00;
  int *piVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  FabArray<amrex::FArrayBox> *pFVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  FabArray<amrex::FArrayBox> *pFVar45;
  long lVar46;
  FabArray<amrex::FArrayBox> *this_01;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  undefined8 *puVar51;
  long lVar52;
  long lVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  long local_630;
  Box zbx;
  Box ybx;
  Box xbx;
  Array4<const_double> vfab;
  FabArray<amrex::EBCellFlagFab> *local_4f0;
  Box result;
  undefined4 uStack_49c;
  int local_498;
  int local_494;
  int local_490;
  Array4<double> fzfab;
  Array4<double> fyfab;
  Array4<const_amrex::EBCellFlag> local_3d8;
  Array<const_MultiCutFab_*,_3> local_398;
  double local_380;
  double local_378;
  double local_370;
  FabArray<amrex::FArrayBox> *local_368;
  FabArray<amrex::FArrayBox> *local_360;
  FabArray<amrex::FArrayBox> *local_358;
  FabArray<amrex::FArrayBox> *local_350;
  FabArray<amrex::FArrayBox> *local_348;
  FabArray<amrex::FArrayBox> *local_340;
  Geometry *local_338;
  long local_330;
  long local_328;
  long local_320;
  ulong local_318;
  long local_310;
  long local_308;
  Array4<const_double> etazfab;
  Array4<const_double> etayfab;
  Array4<const_double> etaxfab;
  Array4<const_double> kapzfab;
  Array4<const_double> kapyfab;
  Array4<const_double> kapxfab;
  MFIter mfi;
  Array4<const_double> local_120;
  Array4<const_double> local_e0;
  Array4<const_double> local_a0;
  Box local_60;
  MFItInfo local_44;
  
  lVar50 = (long)mglev;
  lVar37 = *(long *)(*(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                               super_MLLinOp.m_factory.
                               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    + lVar50 * 8);
  if ((lVar37 == 0) ||
     (this_00 = (EBFArrayBoxFactory *)
                __dynamic_cast(lVar37,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0),
     this_00 == (EBFArrayBoxFactory *)0x0)) {
    local_398._M_elems[0] = (MultiCutFab *)0x0;
    local_398._M_elems[1] = (MultiCutFab *)0x0;
    local_398._M_elems[2] = (MultiCutFab *)0x0;
    local_4f0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_4f0 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
    EBFArrayBoxFactory::getAreaFrac(&local_398,this_00);
  }
  lVar37 = *(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                     m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar46 = lVar50 * 0x480;
  pFVar45 = (FabArray<amrex::FArrayBox> *)
            (*(long *)&(this->super_MLEBABecLap).m_b_coeffs.
                       super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                       .
                       super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
            + lVar46);
  pFVar23 = (FabArray<amrex::FArrayBox> *)
            (*(long *)&(this->m_kappa).
                       super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                       .
                       super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
            + lVar46);
  this_01 = (FabArray<amrex::FArrayBox> *)
            (lVar46 + *(long *)&(this->m_tauflux).
                                super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
            );
  lVar50 = lVar50 * 200;
  local_338 = (Geometry *)(lVar37 + lVar50);
  dVar54 = *(double *)(lVar37 + 0x38 + lVar50);
  dVar58 = *(double *)(lVar37 + 0x40 + lVar50);
  dVar61 = *(double *)(lVar37 + 0x48 + lVar50);
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_007d7ef0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter(&mfi,(FabArrayBase *)mf,&local_44);
  local_360 = pFVar45 + 1;
  local_368 = pFVar45 + 2;
  local_350 = pFVar23 + 1;
  local_358 = pFVar23 + 2;
  local_370 = dVar58 * 0.5;
  local_378 = dVar61 * 0.5;
  local_380 = dVar54 * 0.5;
  dVar58 = dVar58 * 0.25;
  dVar61 = dVar61 * 0.25;
  dVar54 = dVar54 * 0.25;
  local_348 = pFVar23;
  local_340 = pFVar45;
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      MFIter::~MFIter(&mfi);
      for (lVar37 = 0; lVar37 != 0x480; lVar37 = lVar37 + 0x180) {
        mfi._0_12_ = Geometry::periodicity(local_338);
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)
                   ((long)&(this_01->super_FabArrayBase)._vptr_FabArrayBase + lVar37),0,3,
                   (Periodicity *)&mfi,false);
      }
      return;
    }
    MFIter::tilebox(&local_60,&mfi);
    MFIter::nodaltilebox(&xbx,&mfi,0);
    MFIter::nodaltilebox(&ybx,&mfi,1);
    MFIter::nodaltilebox(&zbx,&mfi,2);
    if (local_4f0 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      FVar5 = regular;
LAB_00698ea7:
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>((Array4<double> *)&result,this_01,&mfi)
      ;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&fyfab,this_01 + 1,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&fzfab,this_01 + 2,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&vfab,&mf->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&etaxfab,local_340,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&etayfab,local_360,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&etazfab,local_368,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&kapxfab,local_348,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&kapyfab,local_350,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&kapzfab,local_358,&mfi);
      if (FVar5 == regular) {
        lVar50 = (long)xbx.smallend.vect[1];
        lVar46 = (long)xbx.smallend.vect[0] * 8;
        iVar8 = xbx.smallend.vect[2] + -1;
        lVar37 = (long)xbx.smallend.vect[2];
        iVar20 = xbx.smallend.vect[2];
        while( true ) {
          iVar20 = iVar20 + 1;
          iVar6 = (int)lVar37;
          if (xbx.bigend.vect[2] < iVar6) break;
          lVar48 = (iVar6 - vfab.begin.z) * vfab.kstride;
          lVar42 = (long)local_498;
          lVar29 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
          lVar47 = (lVar50 - local_494) * lVar29 +
                   (lVar37 - local_490) * CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
          lVar21 = result.smallend.vect._0_8_ + lVar46;
          lVar11 = lVar47 + lVar42 * -8 + lVar21;
          lVar53 = lVar47 + CONCAT44(uStack_49c,result.btype.itype) * 8 + lVar42 * -8 + lVar21;
          lVar21 = CONCAT44(uStack_49c,result.btype.itype) * 0x10 + lVar47 + lVar42 * -8 + lVar21;
          lVar30 = etaxfab.jstride * 8;
          lVar47 = (lVar50 - etaxfab.begin.y) * lVar30 +
                   (lVar37 - etaxfab.begin.z) * etaxfab.kstride * 8;
          lVar36 = (long)etaxfab.p + lVar47 + (long)etaxfab.begin.x * -8 + lVar46;
          lVar12 = (long)etaxfab.p +
                   lVar47 + etaxfab.nstride * 8 + (long)etaxfab.begin.x * -8 + lVar46;
          lVar47 = vfab.jstride * 8;
          lVar42 = (lVar50 - vfab.begin.y) * lVar47;
          lVar28 = vfab.kstride * 8;
          lVar40 = (iVar8 - vfab.begin.z) * lVar28 + lVar42;
          lVar42 = (iVar20 - vfab.begin.z) * lVar28 + lVar42;
          lVar28 = (lVar37 - vfab.begin.z) * lVar28;
          lVar34 = (long)vfab.begin.x;
          lVar14 = (long)vfab.p + lVar40 + vfab.nstride * 0x10 + lVar34 * -8 + lVar46;
          lVar26 = (long)vfab.p + lVar40 + lVar34 * -8 + lVar46;
          lVar13 = (long)vfab.p + vfab.nstride * 0x10 + lVar42 + lVar34 * -8 + lVar46;
          lVar40 = (long)vfab.p + lVar42 + lVar34 * -8 + lVar46;
          lVar42 = lVar28 + lVar34 * -8 + lVar46;
          lVar28 = lVar28 + vfab.nstride * 8 + lVar34 * -8 + lVar46;
          lVar10 = (long)kapxfab.p +
                   (lVar50 - kapxfab.begin.y) * kapxfab.jstride * 8 +
                   (lVar37 - kapxfab.begin.z) * kapxfab.kstride * 8 + (long)kapxfab.begin.x * -8 +
                   lVar46;
          iVar41 = (xbx.smallend.vect[1] + 1) - vfab.begin.y;
          iVar44 = (xbx.smallend.vect[1] + -1) - vfab.begin.y;
          lVar34 = lVar50;
          while (lVar34 <= xbx.bigend.vect[1]) {
            if (xbx.smallend.vect[0] <= xbx.bigend.vect[0]) {
              lVar38 = (lVar34 - vfab.begin.y) * vfab.jstride;
              lVar39 = 0;
              do {
                dVar55 = *(double *)((long)vfab.p + lVar39 * 8 + iVar41 * lVar47 + lVar42);
                lVar49 = (long)(((xbx.smallend.vect[0] + -1) - vfab.begin.x) + (int)lVar39);
                dVar64 = vfab.p[lVar48 + ((int)(lVar34 + 1) - vfab.begin.y) * vfab.jstride + lVar49]
                ;
                dVar56 = *(double *)((long)vfab.p + lVar39 * 8 + iVar44 * lVar47 + lVar42);
                dVar57 = vfab.p[lVar48 + (~vfab.begin.y + (int)lVar34) * vfab.jstride + lVar49];
                dVar59 = *(double *)(lVar40 + lVar39 * 8);
                dVar1 = vfab.p[lVar38 + lVar49 + ((int)(lVar37 + 1) - vfab.begin.z) * vfab.kstride];
                dVar63 = *(double *)(lVar26 + lVar39 * 8);
                dVar65 = vfab.p[lVar38 + lVar49 + (~vfab.begin.z + iVar6) * vfab.kstride];
                dVar62 = (((*(double *)(lVar13 + lVar39 * 8) +
                           (vfab.p + lVar38 + lVar49 + ((int)(lVar37 + 1) - vfab.begin.z) *
                                                       vfab.kstride)[vfab.nstride * 2]) -
                          *(double *)(lVar14 + lVar39 * 8)) -
                         (vfab.p + lVar38 + lVar49 + (~vfab.begin.z + iVar6) * vfab.kstride)
                         [vfab.nstride * 2]) * dVar61 +
                         (((*(double *)((long)vfab.p + lVar39 * 8 + iVar41 * lVar47 + lVar28) +
                           (vfab.p + lVar48 + ((int)(lVar34 + 1) - vfab.begin.y) * vfab.jstride +
                                              lVar49)[vfab.nstride]) -
                          *(double *)((long)vfab.p + lVar39 * 8 + iVar44 * lVar47 + lVar28)) -
                         (vfab.p + lVar48 + (~vfab.begin.y + (int)lVar34) * vfab.jstride + lVar49)
                         [vfab.nstride]) * dVar58;
                dVar2 = *(double *)(lVar10 + lVar39 * 8);
                dVar60 = *(double *)(lVar12 + lVar39 * 8);
                *(double *)(lVar11 + lVar39 * 8) =
                     dVar62 * -0.6666666666666666 *
                     (*(double *)(lVar36 + lVar39 * 8) - dVar2) * -0.75 - dVar62 * dVar2;
                dVar60 = -dVar60;
                *(double *)(lVar53 + lVar39 * 8) =
                     (((dVar55 + dVar64) - dVar56) - dVar57) * dVar58 * dVar60;
                *(double *)(lVar21 + lVar39 * 8) =
                     dVar60 * (((dVar59 + dVar1) - dVar63) - dVar65) * dVar61;
                lVar39 = lVar39 + 1;
              } while ((xbx.bigend.vect[0] - xbx.smallend.vect[0]) + 1 != (int)lVar39);
            }
            lVar11 = lVar11 + lVar29;
            lVar53 = lVar53 + lVar29;
            lVar21 = lVar21 + lVar29;
            lVar36 = lVar36 + lVar30;
            lVar12 = lVar12 + lVar30;
            lVar14 = lVar14 + lVar47;
            lVar26 = lVar26 + lVar47;
            lVar13 = lVar13 + lVar47;
            lVar40 = lVar40 + lVar47;
            iVar41 = iVar41 + 1;
            iVar44 = iVar44 + 1;
            lVar10 = lVar10 + kapxfab.jstride * 8;
            lVar34 = lVar34 + 1;
          }
          iVar8 = iVar8 + 1;
          lVar37 = lVar37 + 1;
        }
        lVar46 = (long)ybx.smallend.vect[1];
        lVar37 = (long)ybx.smallend.vect[0] * 8;
        iVar8 = ybx.smallend.vect[2] + -1;
        lVar50 = (long)ybx.smallend.vect[2];
        iVar20 = ybx.smallend.vect[2];
        while( true ) {
          iVar20 = iVar20 + 1;
          if (ybx.bigend.vect[2] < (int)lVar50) break;
          lVar42 = (long)fyfab.begin.x;
          lVar39 = fyfab.jstride * 8;
          lVar47 = (lVar46 - fyfab.begin.y) * lVar39 + (lVar50 - fyfab.begin.z) * fyfab.kstride * 8;
          lVar53 = (long)fyfab.p + lVar47 + lVar42 * -8 + lVar37;
          lVar13 = (long)fyfab.p + lVar47 + fyfab.nstride * 8 + lVar42 * -8 + lVar37;
          lVar52 = (long)fyfab.p + fyfab.nstride * 0x10 + lVar47 + lVar42 * -8 + lVar37;
          lVar12 = etayfab.jstride * 8;
          lVar47 = (lVar46 - etayfab.begin.y) * lVar12 +
                   (lVar50 - etayfab.begin.z) * etayfab.kstride * 8;
          lVar48 = (long)etayfab.p +
                   lVar47 + etayfab.nstride * 8 + (long)etayfab.begin.x * -8 + lVar37;
          lVar36 = (long)etayfab.p + lVar47 + (long)etayfab.begin.x * -8 + lVar37;
          lVar47 = vfab.jstride * 8;
          lVar21 = (lVar46 - vfab.begin.y) * lVar47;
          lVar42 = vfab.kstride * 8;
          lVar14 = (iVar8 - vfab.begin.z) * lVar42;
          lVar10 = vfab.nstride * 0x10;
          lVar26 = (long)vfab.begin.x;
          lVar28 = (long)vfab.p + lVar14 + lVar21 + lVar10 + lVar26 * -8 + lVar37;
          lVar30 = (long)vfab.p + lVar14 + lVar21 + vfab.nstride * 8 + lVar26 * -8 + lVar37;
          lVar34 = (iVar20 - vfab.begin.z) * lVar42;
          lVar29 = (long)vfab.p + lVar34 + lVar21 + lVar10 + lVar26 * -8 + lVar37;
          lVar38 = (long)vfab.p + lVar34 + lVar21 + vfab.nstride * 8 + lVar26 * -8 + lVar37;
          lVar49 = (long)kapyfab.p +
                   (lVar46 - kapyfab.begin.y) * kapyfab.jstride * 8 +
                   (lVar50 - kapyfab.begin.z) * kapyfab.kstride * 8 + (long)kapyfab.begin.x * -8 +
                   lVar37;
          lVar21 = lVar42 * (lVar50 - vfab.begin.z) + lVar21;
          lVar11 = (long)vfab.p + lVar21 + lVar26 * -8 + lVar37 + 8;
          lVar40 = (long)vfab.p + lVar21 + vfab.nstride * 8 + lVar26 * -8 + lVar37 + 8;
          lVar21 = ((int)lVar50 - vfab.begin.z) * vfab.kstride;
          iVar6 = (ybx.smallend.vect[1] + -1) - vfab.begin.y;
          for (lVar42 = lVar46; lVar42 <= ybx.bigend.vect[1]; lVar42 = lVar42 + 1) {
            if (ybx.smallend.vect[0] <= ybx.bigend.vect[0]) {
              lVar16 = lVar47 * iVar6;
              lVar15 = iVar6 * vfab.jstride +
                       (lVar50 - vfab.begin.z) * vfab.kstride + (long)ybx.smallend.vect[0];
              lVar18 = 0;
              do {
                lVar19 = (long)(((ybx.smallend.vect[0] + -1) - vfab.begin.x) + (int)lVar18);
                dVar55 = *(double *)(lVar38 + lVar18 * 8);
                dVar64 = *(double *)
                          ((long)vfab.p +
                          lVar18 * 8 + lVar16 + lVar34 + vfab.nstride * 8 + lVar26 * -8 + lVar37);
                dVar56 = *(double *)(lVar30 + lVar18 * 8);
                dVar57 = *(double *)
                          ((long)vfab.p +
                          lVar18 * 8 + lVar16 + lVar14 + vfab.nstride * 8 + lVar26 * -8 + lVar37);
                dVar63 = (((*(double *)(lVar29 + lVar18 * 8) +
                           *(double *)
                            ((long)vfab.p +
                            lVar18 * 8 + lVar16 + lVar10 + lVar34 + lVar26 * -8 + lVar37)) -
                          *(double *)(lVar28 + lVar18 * 8)) -
                         *(double *)
                          ((long)vfab.p +
                          lVar18 * 8 + lVar16 + lVar14 + lVar10 + lVar26 * -8 + lVar37)) * dVar61 +
                         (((*(double *)(lVar11 + lVar18 * 8) +
                           vfab.p[(lVar15 + lVar18 + 1) - lVar26]) -
                          vfab.p[(lVar42 - vfab.begin.y) * vfab.jstride + lVar21 + lVar19]) -
                         vfab.p[(~vfab.begin.y + (int)lVar42) * vfab.jstride + lVar21 + lVar19]) *
                         dVar54;
                dVar59 = *(double *)(lVar49 + lVar18 * 8);
                dVar1 = *(double *)(lVar48 + lVar18 * 8);
                dVar65 = -*(double *)(lVar36 + lVar18 * 8);
                *(double *)(lVar53 + lVar18 * 8) =
                     (((*(double *)(lVar40 + lVar18 * 8) +
                       vfab.p[(vfab.nstride + lVar15 + lVar18 + 1) - lVar26]) -
                      (vfab.p + (lVar42 - vfab.begin.y) * vfab.jstride + lVar21 + lVar19)
                      [vfab.nstride]) -
                     (vfab.p + (~vfab.begin.y + (int)lVar42) * vfab.jstride + lVar21 + lVar19)
                     [vfab.nstride]) * dVar54 * dVar65;
                *(double *)(lVar13 + lVar18 * 8) =
                     dVar63 * -0.6666666666666666 * (dVar1 - dVar59) * -0.75 - dVar63 * dVar59;
                *(double *)(lVar52 + lVar18 * 8) =
                     dVar65 * (((dVar55 + dVar64) - dVar56) - dVar57) * dVar61;
                lVar18 = lVar18 + 1;
              } while ((ybx.bigend.vect[0] - ybx.smallend.vect[0]) + 1 != (int)lVar18);
            }
            lVar53 = lVar53 + lVar39;
            lVar13 = lVar13 + lVar39;
            lVar52 = lVar52 + lVar39;
            lVar48 = lVar48 + lVar12;
            lVar36 = lVar36 + lVar12;
            lVar28 = lVar28 + lVar47;
            lVar30 = lVar30 + lVar47;
            lVar29 = lVar29 + lVar47;
            lVar38 = lVar38 + lVar47;
            iVar6 = iVar6 + 1;
            lVar49 = lVar49 + kapyfab.jstride * 8;
            lVar11 = lVar11 + lVar47;
            lVar40 = lVar40 + lVar47;
          }
          iVar8 = iVar8 + 1;
          lVar50 = lVar50 + 1;
        }
        local_310 = (long)zbx.smallend.vect[0];
        local_328 = (long)zbx.smallend.vect[1];
        local_330 = local_310 * 8;
        iVar20 = zbx.smallend.vect[2] + -1;
        uVar22 = (zbx.bigend.vect[0] - zbx.smallend.vect[0]) + 1;
        local_318 = (ulong)uVar22;
        lVar37 = (long)zbx.smallend.vect[2];
        while (lVar50 = lVar37, iVar8 = (int)lVar50, iVar8 <= zbx.bigend.vect[2]) {
          lVar34 = (long)vfab.begin.x;
          lVar48 = (long)fzfab.begin.x;
          lVar12 = (lVar50 - fzfab.begin.z) * fzfab.kstride;
          lVar53 = (lVar50 - etazfab.begin.z) * etazfab.kstride;
          lVar11 = (long)(iVar20 - vfab.begin.z) * vfab.kstride * 8;
          lVar40 = (lVar50 - vfab.begin.z) * vfab.kstride * 8;
          lVar21 = lVar11 + vfab.nstride * 0x10 + lVar34 * -8;
          lVar10 = vfab.nstride * 0x10 + lVar40 + lVar34 * -8;
          lVar37 = lVar11 + vfab.nstride * 8 + lVar34 * -8 + local_330;
          lVar46 = lVar40 + vfab.nstride * 8 + lVar34 * -8 + local_330;
          lVar47 = lVar21 + local_330;
          lVar42 = lVar10 + local_330;
          local_308 = vfab.jstride * 8;
          lVar28 = local_328;
          while (lVar28 <= zbx.bigend.vect[1]) {
            if (zbx.bigend.vect[0] < zbx.smallend.vect[0]) {
              lVar28 = lVar28 + 1;
            }
            else {
              lVar14 = vfab.jstride * (lVar28 - vfab.begin.y);
              lVar13 = lVar28 + 1;
              lVar26 = lVar28 - kapzfab.begin.y;
              lVar36 = (lVar28 - etazfab.begin.y) * etazfab.jstride * 8;
              lVar49 = (lVar28 - fzfab.begin.y) * fzfab.jstride * 8;
              lVar38 = ((int)lVar13 - vfab.begin.y) * local_308;
              lVar39 = (~vfab.begin.y + (int)lVar28) * local_308;
              lVar29 = (lVar28 - vfab.begin.y) * local_308;
              lVar30 = 0;
              do {
                lVar28 = (long)(((zbx.smallend.vect[0] + -1) - vfab.begin.x) + (int)lVar30);
                dVar55 = *(double *)((long)vfab.p + lVar30 * 8 + lVar38 + lVar42);
                dVar64 = *(double *)((long)vfab.p + lVar30 * 8 + lVar38 + lVar47);
                dVar56 = *(double *)((long)vfab.p + lVar30 * 8 + lVar39 + lVar42);
                dVar57 = *(double *)((long)vfab.p + lVar30 * 8 + lVar39 + lVar47);
                dVar63 = (((*(double *)((long)vfab.p + lVar30 * 8 + lVar38 + lVar46) +
                           *(double *)((long)vfab.p + lVar30 * 8 + lVar38 + lVar37)) -
                          *(double *)((long)vfab.p + lVar30 * 8 + lVar39 + lVar46)) -
                         *(double *)((long)vfab.p + lVar30 * 8 + lVar39 + lVar37)) * dVar58 +
                         (((*(double *)
                             ((long)vfab.p +
                             lVar30 * 8 + lVar29 + lVar40 + lVar34 * -8 + 8 + local_330) +
                           *(double *)
                            ((long)vfab.p +
                            lVar30 * 8 + lVar29 + lVar11 + lVar34 * -8 + 8 + local_330)) -
                          vfab.p[lVar14 + lVar28 + (iVar8 - vfab.begin.z) * vfab.kstride]) -
                         vfab.p[lVar14 + lVar28 + (~vfab.begin.z + iVar8) * vfab.kstride]) * dVar54;
                dVar59 = *(double *)
                          ((long)kapzfab.p +
                          lVar30 * 8 +
                          lVar26 * kapzfab.jstride * 8 +
                          (lVar50 - kapzfab.begin.z) * kapzfab.kstride * 8 +
                          (long)kapzfab.begin.x * -8 + local_330);
                dVar1 = *(double *)
                         ((long)etazfab.p +
                         lVar30 * 8 +
                         lVar36 + etazfab.nstride * 0x10 + lVar53 * 8 + (long)etazfab.begin.x * -8 +
                                  local_330);
                dVar65 = -*(double *)
                           ((long)etazfab.p +
                           lVar30 * 8 + lVar36 + lVar53 * 8 + (long)etazfab.begin.x * -8 + local_330
                           );
                *(double *)
                 ((long)fzfab.p + lVar30 * 8 + lVar49 + lVar12 * 8 + lVar48 * -8 + local_330) =
                     (((*(double *)((long)vfab.p + lVar30 * 8 + lVar29 + lVar10 + 8 + local_330) +
                       *(double *)((long)vfab.p + lVar30 * 8 + lVar29 + lVar21 + local_330 + 8)) -
                      (vfab.p + lVar14 + lVar28 + (iVar8 - vfab.begin.z) * vfab.kstride)
                      [vfab.nstride * 2]) -
                     (vfab.p + lVar14 + lVar28 + (~vfab.begin.z + iVar8) * vfab.kstride)
                     [vfab.nstride * 2]) * dVar54 * dVar65;
                *(double *)
                 ((long)fzfab.p +
                 lVar30 * 8 + lVar49 + fzfab.nstride * 8 + lVar12 * 8 + lVar48 * -8 + local_330) =
                     dVar65 * (((dVar55 + dVar64) - dVar56) - dVar57) * dVar58;
                *(double *)
                 ((long)fzfab.p +
                 lVar30 * 8 + lVar49 + fzfab.nstride * 0x10 + lVar12 * 8 + lVar48 * -8 + local_330)
                     = dVar63 * -0.6666666666666666 * (dVar1 - dVar59) * -0.75 - dVar63 * dVar59;
                lVar30 = lVar30 + 1;
                lVar28 = lVar13;
              } while (uVar22 != (uint)lVar30);
            }
          }
          iVar20 = iVar20 + 1;
          local_320 = lVar50;
          lVar37 = lVar50 + 1;
        }
      }
      else {
        MultiCutFab::const_array(&local_a0,local_398._M_elems[0],&mfi);
        MultiCutFab::const_array(&local_e0,local_398._M_elems[1],&mfi);
        MultiCutFab::const_array(&local_120,local_398._M_elems[2],&mfi);
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_3d8,local_4f0,&mfi);
        lVar50 = (long)xbx.smallend.vect[0];
        lVar37 = lVar50 * 8;
        for (lVar46 = (long)xbx.smallend.vect[2]; iVar20 = (int)lVar46, iVar20 <= xbx.bigend.vect[2]
            ; lVar46 = lVar46 + 1) {
          lVar42 = (long)local_a0.p +
                   ((long)xbx.smallend.vect[1] - (long)local_a0.begin.y) * local_a0.jstride * 8 +
                   (lVar46 - local_a0.begin.z) * local_a0.kstride * 8 + (long)local_a0.begin.x * -8
                   + lVar37;
          for (lVar47 = (long)xbx.smallend.vect[1]; lVar47 <= xbx.bigend.vect[1];
              lVar47 = lVar47 + 1) {
            if (xbx.smallend.vect[0] <= xbx.bigend.vect[0]) {
              lVar48 = (long)vfab.begin.x;
              lVar10 = (long)vfab.begin.y;
              lVar11 = (lVar47 - local_494) *
                       CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
              lVar38 = (long)local_498;
              lVar28 = lVar11 * 8 +
                       (lVar46 - local_490) * CONCAT44(result.bigend.vect[2],result.bigend.vect[1])
                       * 8;
              lVar12 = (lVar46 - local_3d8.begin.z) * local_3d8.kstride;
              lVar29 = (lVar47 - local_3d8.begin.y) * local_3d8.jstride;
              lVar13 = vfab.jstride * 8;
              lVar52 = vfab.kstride * 8;
              lVar21 = (lVar46 - vfab.begin.z) * lVar52;
              lVar53 = (lVar47 - lVar10) * lVar13;
              lVar34 = lVar21 + vfab.nstride * 8 + lVar48 * -8 + lVar37;
              lVar21 = lVar21 + lVar48 * -8 + lVar37;
              lVar40 = vfab.nstride * 0x10 + lVar53 + lVar48 * -8 + lVar37;
              lVar48 = lVar53 + lVar48 * -8 + lVar37;
              lVar39 = lVar28 + lVar38 * -8 + result.smallend.vect._0_8_ + lVar37;
              lVar26 = (lVar46 - etaxfab.begin.z) * etaxfab.kstride;
              lVar30 = (lVar47 - etaxfab.begin.y) * etaxfab.jstride;
              lVar36 = lVar28 + CONCAT44(uStack_49c,result.btype.itype) * 8 + lVar38 * -8 +
                       result.smallend.vect._0_8_ + lVar37;
              iVar8 = (int)lVar47;
              lVar14 = -lVar10;
              lVar28 = -(long)vfab.begin.z;
              lVar49 = 0;
              lVar53 = lVar50;
              do {
                dVar55 = *(double *)(lVar42 + lVar49 * 8);
                if ((dVar55 != 0.0) || (NAN(dVar55))) {
                  uVar22 = local_3d8.p
                           [lVar50 + ((lVar12 + lVar29 + lVar49) - (long)local_3d8.begin.x)].flag;
                  uVar17 = uVar22 >> 0x15 & 1;
                  iVar41 = (int)(short)uVar22 >> 0xf;
                  iVar6 = uVar17 - iVar41;
                  dVar55 = 1.0;
                  if (iVar6 != 1) {
                    dVar55 = 0.0;
                  }
                  dVar64 = 0.5;
                  if (iVar6 != 2) {
                    dVar64 = dVar55;
                  }
                  uVar4 = local_3d8.p
                          [lVar50 + ((lVar12 + lVar29 + lVar49 + -1) - (long)local_3d8.begin.x)].
                          flag;
                  uVar7 = uVar4 >> 0x15 & 1;
                  iVar44 = (int)(short)uVar4 >> 0xf;
                  iVar6 = uVar7 - iVar44;
                  dVar55 = 1.0;
                  if (iVar6 != 1) {
                    dVar55 = 0.0;
                  }
                  dVar56 = 0.5;
                  if (iVar6 != 2) {
                    dVar56 = dVar55;
                  }
                  uVar24 = uVar22 >> 0x1b & 1;
                  iVar35 = (int)(uVar22 << 0x16) >> 0x1f;
                  iVar6 = uVar24 - iVar35;
                  dVar55 = 1.0;
                  if (iVar6 != 1) {
                    dVar55 = 0.0;
                  }
                  dVar57 = 0.5;
                  if (iVar6 != 2) {
                    dVar57 = dVar55;
                  }
                  uVar22 = uVar4 >> 0x1b & 1;
                  iVar6 = (int)(uVar4 << 0x16) >> 0x1f;
                  iVar31 = uVar22 - iVar6;
                  dVar55 = 1.0;
                  if (iVar31 != 1) {
                    dVar55 = 0.0;
                  }
                  dVar59 = 0.5;
                  if (iVar31 != 2) {
                    dVar59 = dVar55;
                  }
                  lVar18 = ((ulong)uVar17 + (iVar8 - lVar10)) * lVar13;
                  dVar55 = *(double *)((long)vfab.p + lVar49 * 8 + lVar18 + lVar21);
                  lVar43 = ((iVar41 + iVar8) + lVar14) * lVar13;
                  dVar1 = *(double *)((long)vfab.p + lVar49 * 8 + lVar43 + lVar21);
                  lVar15 = ((int)(uVar7 + iVar8) + lVar14) * lVar13;
                  dVar63 = *(double *)((long)vfab.p + lVar49 * 8 + lVar15 + lVar21 + -8);
                  lVar32 = ((iVar44 + iVar8) + lVar14) * lVar13;
                  dVar65 = *(double *)((long)vfab.p + lVar49 * 8 + lVar32 + lVar21 + -8);
                  lVar16 = ((int)(uVar24 + iVar20) + lVar28) * lVar52;
                  dVar2 = *(double *)((long)vfab.p + lVar49 * 8 + lVar16 + lVar48);
                  lVar19 = ((iVar35 + iVar20) + lVar28) * lVar52;
                  dVar60 = *(double *)((long)vfab.p + lVar49 * 8 + lVar19 + lVar48);
                  lVar33 = ((int)(uVar22 + iVar20) + lVar28) * lVar52;
                  dVar62 = *(double *)((long)vfab.p + lVar49 * 8 + lVar33 + lVar48 + -8);
                  lVar27 = ((iVar6 + iVar20) + lVar28) * lVar52;
                  dVar67 = *(double *)((long)vfab.p + lVar49 * 8 + lVar27 + lVar48 + -8);
                  dVar66 = ((*(double *)((long)vfab.p + lVar49 * 8 + lVar16 + lVar40) -
                            *(double *)((long)vfab.p + lVar49 * 8 + lVar19 + lVar40)) * dVar57 +
                           (*(double *)((long)vfab.p + lVar49 * 8 + lVar33 + lVar40 + -8) -
                           *(double *)((long)vfab.p + lVar49 * 8 + lVar27 + lVar40 + -8)) * dVar59)
                           * local_378 +
                           ((*(double *)((long)vfab.p + lVar49 * 8 + lVar18 + lVar34) -
                            *(double *)((long)vfab.p + lVar49 * 8 + lVar43 + lVar34)) * dVar64 +
                           (*(double *)((long)vfab.p + lVar49 * 8 + lVar15 + lVar34 + -8) -
                           *(double *)((long)vfab.p + lVar49 * 8 + lVar32 + lVar34 + -8)) * dVar56)
                           * local_370;
                  lVar15 = (lVar50 - lVar38) + lVar49;
                  dVar3 = etaxfab.p[lVar50 + ((etaxfab.nstride + lVar26 + lVar30 + lVar49) -
                                             (long)etaxfab.begin.x)];
                  *(double *)(lVar39 + lVar49 * 8) =
                       dVar66 * -0.6666666666666666 *
                       (etaxfab.p[lVar50 + ((lVar26 + lVar30 + lVar49) - (long)etaxfab.begin.x)] -
                       kapxfab.p[lVar50 + (((lVar46 - kapxfab.begin.z) * kapxfab.kstride +
                                           (lVar47 - kapxfab.begin.y) * kapxfab.jstride + lVar49) -
                                          (long)kapxfab.begin.x)]) * -0.75 -
                       dVar66 * kapxfab.p[lVar50 + (((lVar46 - kapxfab.begin.z) * kapxfab.kstride +
                                                    (lVar47 - kapxfab.begin.y) * kapxfab.jstride +
                                                    lVar49) - (long)kapxfab.begin.x)];
                  *(double *)(lVar36 + lVar49 * 8) =
                       ((dVar55 - dVar1) * dVar64 + (dVar63 - dVar65) * dVar56) * local_370 * -dVar3
                  ;
                  dVar55 = -dVar3 * ((dVar2 - dVar60) * dVar57 + (dVar62 - dVar67) * dVar59) *
                                    local_378;
                }
                else {
                  lVar15 = lVar53 - lVar38;
                  *(undefined8 *)(lVar39 + lVar49 * 8) = 0;
                  *(undefined8 *)(lVar36 + lVar49 * 8) = 0;
                  dVar55 = 0.0;
                }
                *(double *)
                 (CONCAT44(uStack_49c,result.btype.itype) * 0x10 +
                  lVar11 * 8 + result.smallend.vect._0_8_ +
                  ((long)iVar20 - (long)local_490) *
                  CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 + lVar15 * 8) = dVar55;
                lVar53 = lVar53 + 1;
                lVar49 = lVar49 + 1;
              } while ((xbx.bigend.vect[0] - xbx.smallend.vect[0]) + 1 != (int)lVar49);
            }
            lVar42 = lVar42 + local_a0.jstride * 8;
          }
        }
        lVar50 = (long)ybx.smallend.vect[0];
        lVar46 = (long)ybx.smallend.vect[1];
        lVar37 = lVar50 * 8;
        for (lVar47 = (long)ybx.smallend.vect[2]; iVar20 = (int)lVar47, iVar20 <= ybx.bigend.vect[2]
            ; lVar47 = lVar47 + 1) {
          lVar28 = (long)local_e0.p +
                   (lVar46 - local_e0.begin.y) * local_e0.jstride * 8 +
                   (lVar47 - local_e0.begin.z) * local_e0.kstride * 8 + (long)local_e0.begin.x * -8
                   + lVar37;
          local_630 = lVar46 + -1;
          for (lVar42 = lVar46; lVar42 <= ybx.bigend.vect[1]; lVar42 = lVar42 + 1) {
            if (ybx.smallend.vect[0] <= ybx.bigend.vect[0]) {
              lVar29 = lVar42 - vfab.begin.y;
              lVar30 = ((long)iVar20 - (long)vfab.begin.z) * vfab.kstride;
              lVar26 = (lVar29 + -1) * vfab.jstride;
              lVar13 = (lVar42 - fyfab.begin.y) * fyfab.jstride;
              lVar10 = (long)fyfab.begin.x;
              lVar49 = (lVar47 - fyfab.begin.z) * fyfab.kstride;
              lVar36 = (lVar47 - etayfab.begin.z) * etayfab.kstride;
              lVar39 = (lVar42 - etayfab.begin.y) * etayfab.jstride;
              lVar53 = (long)vfab.begin.x;
              lVar21 = lVar29 * vfab.jstride * 8;
              lVar48 = (local_630 - vfab.begin.y) * vfab.jstride * 8;
              lVar34 = lVar21 + vfab.nstride * 0x10 + lVar53 * -8 + lVar37;
              lVar21 = lVar21 + vfab.nstride * 8 + lVar53 * -8 + lVar37;
              lVar40 = vfab.nstride * 0x10 + lVar48 + lVar53 * -8 + lVar37;
              lVar48 = lVar48 + vfab.nstride * 8 + lVar53 * -8 + lVar37;
              lVar11 = (lVar47 - local_3d8.begin.z) * local_3d8.kstride;
              lVar38 = vfab.kstride * 8;
              lVar14 = -(long)vfab.begin.z;
              lVar12 = 0;
              lVar53 = lVar50;
              do {
                dVar64 = 1.0;
                dVar55 = *(double *)(lVar28 + lVar12 * 8);
                if ((dVar55 != 0.0) || (NAN(dVar55))) {
                  uVar22 = *(uint32_t *)
                            ((long)&local_3d8.p
                                    [lVar50 + ((lVar11 + lVar12) - (long)local_3d8.begin.x)].flag +
                            (lVar42 - local_3d8.begin.y) * local_3d8.jstride * 4);
                  uVar17 = uVar22 >> 0x13 & 1;
                  iVar8 = (int)(uVar22 << 0xe) >> 0x1f;
                  iVar6 = uVar17 - iVar8;
                  dVar55 = 1.0;
                  if (iVar6 != 1) {
                    dVar55 = 0.0;
                  }
                  dVar56 = 0.5;
                  if (iVar6 != 2) {
                    dVar56 = dVar55;
                  }
                  uVar4 = *(uint32_t *)
                           ((long)&local_3d8.p
                                   [lVar50 + ((lVar11 + lVar12) - (long)local_3d8.begin.x)].flag +
                           (local_630 - local_3d8.begin.y) * local_3d8.jstride * 4);
                  uVar7 = uVar4 >> 0x13 & 1;
                  iVar41 = (int)(uVar4 << 0xe) >> 0x1f;
                  iVar6 = uVar7 - iVar41;
                  dVar55 = 1.0;
                  if (iVar6 != 1) {
                    dVar55 = 0.0;
                  }
                  dVar57 = 0.5;
                  if (iVar6 != 2) {
                    dVar57 = dVar55;
                  }
                  uVar24 = uVar22 >> 0x1b & 1;
                  iVar44 = (int)(uVar22 << 0x16) >> 0x1f;
                  iVar6 = uVar24 - iVar44;
                  dVar55 = 1.0;
                  if (iVar6 != 1) {
                    dVar55 = 0.0;
                  }
                  dVar59 = 0.5;
                  if (iVar6 != 2) {
                    dVar59 = dVar55;
                  }
                  uVar22 = uVar4 >> 0x1b & 1;
                  iVar35 = (int)(uVar4 << 0x16) >> 0x1f;
                  iVar6 = uVar22 - iVar35;
                  if (iVar6 != 1) {
                    dVar64 = 0.0;
                  }
                  dVar55 = 0.5;
                  if (iVar6 != 2) {
                    dVar55 = dVar64;
                  }
                  iVar6 = (ybx.smallend.vect[0] - vfab.begin.x) + (int)lVar12;
                  lVar52 = ((int)(uVar24 + iVar20) + lVar14) * lVar38;
                  dVar64 = *(double *)((long)vfab.p + lVar12 * 8 + lVar52 + lVar21);
                  lVar15 = ((iVar44 + iVar20) + lVar14) * lVar38;
                  dVar1 = *(double *)((long)vfab.p + lVar12 * 8 + lVar15 + lVar21);
                  lVar18 = ((int)(uVar22 + iVar20) + lVar14) * lVar38;
                  dVar63 = *(double *)((long)vfab.p + lVar12 * 8 + lVar18 + lVar48);
                  lVar16 = ((iVar35 + iVar20) + lVar14) * lVar38;
                  dVar65 = *(double *)((long)vfab.p + lVar12 * 8 + lVar16 + lVar48);
                  dVar67 = ((*(double *)((long)vfab.p + lVar12 * 8 + lVar52 + lVar34) -
                            *(double *)((long)vfab.p + lVar12 * 8 + lVar15 + lVar34)) * dVar59 +
                           (*(double *)((long)vfab.p + lVar12 * 8 + lVar18 + lVar40) -
                           *(double *)((long)vfab.p + lVar12 * 8 + lVar16 + lVar40)) * dVar55) *
                           local_378 +
                           ((vfab.p[vfab.jstride * lVar29 + lVar30 + (int)(uVar17 + iVar6)] -
                            vfab.p[vfab.jstride * lVar29 + lVar30 + (iVar8 + iVar6)]) * dVar56 +
                           (vfab.p[lVar26 + lVar30 + (int)(uVar7 + iVar6)] -
                           vfab.p[lVar26 + lVar30 + (iVar41 + iVar6)]) * dVar57) * local_380;
                  dVar2 = kapyfab.p[lVar50 + (((lVar47 - kapyfab.begin.z) * kapyfab.kstride +
                                              (lVar42 - kapyfab.begin.y) * kapyfab.jstride + lVar12)
                                             - (long)kapyfab.begin.x)];
                  dVar60 = etayfab.p[lVar50 + ((etayfab.nstride + lVar36 + lVar39 + lVar12) -
                                              (long)etayfab.begin.x)];
                  dVar62 = etayfab.p[lVar50 + ((lVar36 + lVar39 + lVar12) - (long)etayfab.begin.x)];
                  lVar52 = (lVar50 - lVar10) + lVar12;
                  fyfab.p[lVar50 + ((lVar49 + lVar13 + lVar12) - lVar10)] =
                       (((vfab.p + vfab.jstride * lVar29 + lVar30 + (int)(uVar17 + iVar6))
                         [vfab.nstride] -
                        (vfab.p + vfab.jstride * lVar29 + lVar30 + (iVar8 + iVar6))[vfab.nstride]) *
                        dVar56 + ((vfab.p + lVar26 + lVar30 + (int)(uVar7 + iVar6))[vfab.nstride] -
                                 (vfab.p + lVar26 + lVar30 + (iVar41 + iVar6))[vfab.nstride]) *
                                 dVar57) * local_380 * -dVar62;
                  fyfab.p[lVar50 + ((fyfab.nstride + lVar49 + lVar13 + lVar12) - lVar10)] =
                       dVar67 * -0.6666666666666666 * (dVar60 - dVar2) * -0.75 - dVar67 * dVar2;
                  dVar55 = -dVar62 * ((dVar64 - dVar1) * dVar59 + (dVar63 - dVar65) * dVar55) *
                                     local_378;
                }
                else {
                  lVar52 = lVar53 - lVar10;
                  fyfab.p[lVar50 + ((lVar49 + lVar13 + lVar12) - lVar10)] = 0.0;
                  fyfab.p[lVar50 + ((fyfab.nstride + lVar49 + lVar13 + lVar12) - lVar10)] = 0.0;
                  dVar55 = 0.0;
                }
                fyfab.p[lVar13 + ((long)iVar20 - (long)fyfab.begin.z) * fyfab.kstride +
                                 fyfab.nstride * 2 + lVar52] = dVar55;
                lVar53 = lVar53 + 1;
                lVar12 = lVar12 + 1;
              } while ((ybx.bigend.vect[0] - ybx.smallend.vect[0]) + 1 != (int)lVar12);
            }
            local_630 = local_630 + 1;
            lVar28 = lVar28 + local_e0.jstride * 8;
          }
        }
        lVar50 = (long)zbx.smallend.vect[0];
        lVar37 = lVar50 * 8;
        iVar20 = zbx.smallend.vect[2] + -1;
        for (lVar46 = (long)zbx.smallend.vect[2]; iVar8 = (int)lVar46, iVar8 <= zbx.bigend.vect[2];
            lVar46 = lVar46 + 1) {
          lVar42 = (long)local_120.p +
                   ((long)zbx.smallend.vect[1] - (long)local_120.begin.y) * local_120.jstride * 8 +
                   (lVar46 - local_120.begin.z) * local_120.kstride * 8 +
                   (long)local_120.begin.x * -8 + lVar37;
          for (lVar47 = (long)zbx.smallend.vect[1]; lVar47 <= zbx.bigend.vect[1];
              lVar47 = lVar47 + 1) {
            if (zbx.smallend.vect[0] <= zbx.bigend.vect[0]) {
              lVar12 = (lVar47 - vfab.begin.y) * vfab.jstride;
              lVar14 = (iVar8 - vfab.begin.z) * vfab.kstride;
              lVar26 = ((iVar8 + -1) - vfab.begin.z) * vfab.kstride;
              lVar30 = (lVar47 - fzfab.begin.y) * fzfab.jstride;
              lVar13 = (long)fzfab.begin.x;
              lVar39 = (lVar46 - fzfab.begin.z) * fzfab.kstride;
              lVar29 = (lVar46 - etazfab.begin.z) * etazfab.kstride;
              lVar36 = (lVar47 - etazfab.begin.y) * etazfab.jstride;
              lVar21 = (lVar46 - vfab.begin.z) * vfab.kstride * 8;
              lVar48 = ((long)iVar20 - (long)vfab.begin.z) * vfab.kstride * 8;
              lVar28 = (long)vfab.begin.x;
              lVar34 = lVar21 + vfab.nstride * 0x10 + lVar28 * -8 + lVar37;
              lVar21 = lVar21 + vfab.nstride * 8 + lVar28 * -8 + lVar37;
              lVar40 = vfab.nstride * 0x10 + lVar48 + lVar28 * -8 + lVar37;
              lVar48 = lVar48 + vfab.nstride * 8 + lVar28 * -8 + lVar37;
              lVar10 = (lVar47 - local_3d8.begin.y) * local_3d8.jstride;
              lVar11 = vfab.jstride * 8;
              lVar28 = -(long)vfab.begin.y;
              lVar38 = 0;
              lVar53 = lVar50;
              do {
                dVar64 = 1.0;
                dVar55 = *(double *)(lVar42 + lVar38 * 8);
                if ((dVar55 != 0.0) || (NAN(dVar55))) {
                  uVar22 = *(uint32_t *)
                            ((long)&local_3d8.p
                                    [lVar50 + ((lVar10 + lVar38) - (long)local_3d8.begin.x)].flag +
                            (lVar46 - local_3d8.begin.z) * local_3d8.kstride * 4);
                  uVar17 = uVar22 >> 0x13 & 1;
                  iVar41 = (int)(uVar22 << 0xe) >> 0x1f;
                  iVar6 = uVar17 - iVar41;
                  dVar55 = 1.0;
                  if (iVar6 != 1) {
                    dVar55 = 0.0;
                  }
                  dVar56 = 0.5;
                  if (iVar6 != 2) {
                    dVar56 = dVar55;
                  }
                  uVar4 = *(uint32_t *)
                           ((long)&local_3d8.p
                                   [lVar50 + ((lVar10 + lVar38) - (long)local_3d8.begin.x)].flag +
                           ((long)iVar20 - (long)local_3d8.begin.z) * local_3d8.kstride * 4);
                  uVar7 = uVar4 >> 0x13 & 1;
                  iVar44 = (int)(uVar4 << 0xe) >> 0x1f;
                  iVar6 = uVar7 - iVar44;
                  dVar55 = 1.0;
                  if (iVar6 != 1) {
                    dVar55 = 0.0;
                  }
                  dVar57 = 0.5;
                  if (iVar6 != 2) {
                    dVar57 = dVar55;
                  }
                  uVar24 = uVar22 >> 0x15 & 1;
                  iVar35 = (int)(short)uVar22 >> 0xf;
                  iVar6 = uVar24 - iVar35;
                  dVar55 = 1.0;
                  if (iVar6 != 1) {
                    dVar55 = 0.0;
                  }
                  dVar59 = 0.5;
                  if (iVar6 != 2) {
                    dVar59 = dVar55;
                  }
                  uVar22 = uVar4 >> 0x15 & 1;
                  iVar6 = (int)(short)uVar4 >> 0xf;
                  iVar31 = uVar22 - iVar6;
                  if (iVar31 != 1) {
                    dVar64 = 0.0;
                  }
                  dVar55 = 0.5;
                  if (iVar31 != 2) {
                    dVar55 = dVar64;
                  }
                  iVar25 = (zbx.smallend.vect[0] - vfab.begin.x) + (int)lVar38;
                  iVar31 = (int)lVar47;
                  lVar49 = ((int)(uVar24 + iVar31) + lVar28) * lVar11;
                  lVar15 = ((iVar35 + iVar31) + lVar28) * lVar11;
                  lVar16 = ((int)(uVar22 + iVar31) + lVar28) * lVar11;
                  lVar52 = ((iVar6 + iVar31) + lVar28) * lVar11;
                  dVar64 = *(double *)((long)vfab.p + lVar38 * 8 + lVar49 + lVar34);
                  dVar1 = *(double *)((long)vfab.p + lVar38 * 8 + lVar15 + lVar34);
                  dVar63 = *(double *)((long)vfab.p + lVar38 * 8 + lVar16 + lVar40);
                  dVar67 = ((*(double *)((long)vfab.p + lVar38 * 8 + lVar49 + lVar21) -
                            *(double *)((long)vfab.p + lVar38 * 8 + lVar15 + lVar21)) * dVar59 +
                           (*(double *)((long)vfab.p + lVar38 * 8 + lVar16 + lVar48) -
                           *(double *)((long)vfab.p + lVar38 * 8 + lVar52 + lVar48)) * dVar55) *
                           local_370 +
                           ((vfab.p[lVar12 + lVar14 + (int)(uVar17 + iVar25)] -
                            vfab.p[lVar12 + lVar14 + (iVar41 + iVar25)]) * dVar56 +
                           (vfab.p[lVar12 + lVar26 + (int)(uVar7 + iVar25)] -
                           vfab.p[lVar12 + lVar26 + (iVar44 + iVar25)]) * dVar57) * local_380;
                  dVar65 = *(double *)((long)vfab.p + lVar38 * 8 + lVar52 + lVar40);
                  dVar2 = kapzfab.p[lVar50 + (((lVar46 - kapzfab.begin.z) * kapzfab.kstride +
                                              (lVar47 - kapzfab.begin.y) * kapzfab.jstride + lVar38)
                                             - (long)kapzfab.begin.x)];
                  dVar60 = etazfab.p[lVar50 + ((lVar29 + lVar36 + etazfab.nstride * 2 + lVar38) -
                                              (long)etazfab.begin.x)];
                  dVar62 = etazfab.p[lVar50 + ((lVar29 + lVar36 + lVar38) - (long)etazfab.begin.x)];
                  lVar49 = (lVar50 - lVar13) + lVar38;
                  fzfab.p[lVar50 + ((lVar39 + lVar30 + lVar38) - lVar13)] =
                       (((vfab.p + lVar12 + lVar14 + (int)(uVar17 + iVar25))[vfab.nstride * 2] -
                        (vfab.p + lVar12 + lVar14 + (iVar41 + iVar25))[vfab.nstride * 2]) * dVar56 +
                       ((vfab.p + lVar12 + lVar26 + (int)(uVar7 + iVar25))[vfab.nstride * 2] -
                       (vfab.p + lVar12 + lVar26 + (iVar44 + iVar25))[vfab.nstride * 2]) * dVar57) *
                       local_380 * -dVar62;
                  fzfab.p[lVar50 + ((lVar39 + lVar30 + fzfab.nstride + lVar38) - lVar13)] =
                       -dVar62 * ((dVar64 - dVar1) * dVar59 + (dVar63 - dVar65) * dVar55) *
                                 local_370;
                  dVar55 = dVar67 * -0.6666666666666666 * (dVar60 - dVar2) * -0.75 - dVar67 * dVar2;
                }
                else {
                  lVar49 = lVar53 - lVar13;
                  fzfab.p[lVar50 + ((lVar39 + lVar30 + lVar38) - lVar13)] = 0.0;
                  fzfab.p[lVar50 + ((lVar39 + lVar30 + fzfab.nstride + lVar38) - lVar13)] = 0.0;
                  dVar55 = 0.0;
                }
                fzfab.p[lVar30 + ((long)iVar8 - (long)fzfab.begin.z) * fzfab.kstride +
                                 fzfab.nstride * 2 + lVar49] = dVar55;
                lVar53 = lVar53 + 1;
                lVar38 = lVar38 + 1;
              } while ((zbx.bigend.vect[0] - zbx.smallend.vect[0]) + 1 != (int)lVar38);
            }
            lVar42 = lVar42 + local_120.jstride * 8;
          }
          iVar20 = iVar20 + 1;
        }
      }
    }
    else {
      piVar9 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar9 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      result.bigend.vect[2] = local_60.bigend.vect[2];
      result.btype.itype = local_60.btype.itype;
      result.smallend.vect[0] = local_60.smallend.vect[0];
      result.smallend.vect[1] = local_60.smallend.vect[1];
      result.smallend.vect[2] = local_60.smallend.vect[2] + -1;
      result.bigend.vect[0] = local_60.bigend.vect[0] + 1;
      result.smallend.vect[1] = result.smallend.vect[1] + -1;
      result.smallend.vect[0] = result.smallend.vect[0] + -1;
      result.bigend.vect[1] = local_60.bigend.vect[1] + 1;
      result.bigend.vect[2] = result.bigend.vect[2] + 1;
      FVar5 = EBCellFlagFab::getType
                        ((local_4f0->m_fabs_v).
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar9],&result);
      if (FVar5 != covered) goto LAB_00698ea7;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>((Array4<double> *)&result,this_01,&mfi)
      ;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&fyfab,this_01 + 1,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&fzfab,this_01 + 2,&mfi);
      lVar37 = 0;
      for (lVar50 = 0; lVar46 = (long)xbx.smallend.vect[2], lVar50 != 3; lVar50 = lVar50 + 1) {
        for (; lVar47 = (long)xbx.smallend.vect[1], (int)lVar46 <= xbx.bigend.vect[2];
            lVar46 = lVar46 + 1) {
          for (; (int)lVar47 <= xbx.bigend.vect[1]; lVar47 = lVar47 + 1) {
            puVar51 = (undefined8 *)
                      (CONCAT44(uStack_49c,result.btype.itype) * lVar37 +
                       (lVar46 - local_490) * CONCAT44(result.bigend.vect[2],result.bigend.vect[1])
                       * 8 + (lVar47 - local_494) *
                             CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                       (long)local_498 * -8 +
                      result.smallend.vect._0_8_ + (long)xbx.smallend.vect[0] * 8);
            for (lVar42 = (long)xbx.smallend.vect[0]; lVar42 <= xbx.bigend.vect[0];
                lVar42 = lVar42 + 1) {
              *puVar51 = 0;
              puVar51 = puVar51 + 1;
            }
          }
        }
        lVar37 = lVar37 + 8;
      }
      lVar37 = 0;
      for (lVar50 = 0; lVar46 = (long)ybx.smallend.vect[2], lVar50 != 3; lVar50 = lVar50 + 1) {
        for (; lVar47 = (long)ybx.smallend.vect[1], (int)lVar46 <= ybx.bigend.vect[2];
            lVar46 = lVar46 + 1) {
          for (; (int)lVar47 <= ybx.bigend.vect[1]; lVar47 = lVar47 + 1) {
            puVar51 = (undefined8 *)
                      ((long)fyfab.p +
                      fyfab.nstride * lVar37 +
                      (lVar46 - fyfab.begin.z) * fyfab.kstride * 8 +
                      (lVar47 - fyfab.begin.y) * fyfab.jstride * 8 + (long)fyfab.begin.x * -8 +
                      (long)ybx.smallend.vect[0] * 8);
            for (lVar42 = (long)ybx.smallend.vect[0]; lVar42 <= ybx.bigend.vect[0];
                lVar42 = lVar42 + 1) {
              *puVar51 = 0;
              puVar51 = puVar51 + 1;
            }
          }
        }
        lVar37 = lVar37 + 8;
      }
      lVar37 = 0;
      for (lVar50 = 0; lVar46 = (long)zbx.smallend.vect[2], lVar50 != 3; lVar50 = lVar50 + 1) {
        for (; lVar47 = (long)zbx.smallend.vect[1], (int)lVar46 <= zbx.bigend.vect[2];
            lVar46 = lVar46 + 1) {
          for (; (int)lVar47 <= zbx.bigend.vect[1]; lVar47 = lVar47 + 1) {
            puVar51 = (undefined8 *)
                      ((long)fzfab.p +
                      fzfab.nstride * lVar37 +
                      (lVar46 - fzfab.begin.z) * fzfab.kstride * 8 +
                      (lVar47 - fzfab.begin.y) * fzfab.jstride * 8 + (long)fzfab.begin.x * -8 +
                      (long)zbx.smallend.vect[0] * 8);
            for (lVar42 = (long)zbx.smallend.vect[0]; lVar42 <= zbx.bigend.vect[0];
                lVar42 = lVar42 + 1) {
              *puVar51 = 0;
              puVar51 = puVar51 + 1;
            }
          }
        }
        lVar37 = lVar37 + 8;
      }
    }
    MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void
MLEBTensorOp::compCrossTerms(int amrlev, int mglev, MultiFab const& mf) const
{
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    Array<MultiFab,AMREX_SPACEDIM> const& etamf = m_b_coeffs[amrlev][mglev];
    Array<MultiFab,AMREX_SPACEDIM> const& kapmf = m_kappa[amrlev][mglev];
    Array<MultiFab,AMREX_SPACEDIM>& fluxmf = m_tauflux[amrlev][mglev];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        AMREX_D_TERM(Box const xbx = mfi.nodaltilebox(0);,
                     Box const ybx = mfi.nodaltilebox(1);,
                     Box const zbx = mfi.nodaltilebox(2););

        // grow by 1 because of corners
        auto fabtyp = (flags) ? (*flags)[mfi].getType(amrex::grow(bx,1)) : FabType::regular;

        if (fabtyp == FabType::covered) {
          AMREX_D_TERM(Array4<Real> const& fxfab = fluxmf[0].array(mfi);,
                       Array4<Real> const& fyfab = fluxmf[1].array(mfi);,
                       Array4<Real> const& fzfab = fluxmf[2].array(mfi););
          AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
          ( xbx, txbx,
            {
                AMREX_LOOP_4D(txbx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fxfab(i,j,k,n) = 0.0;
                });
            }
            , ybx, tybx,
            {
                AMREX_LOOP_4D(tybx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fyfab(i,j,k,n) = 0.0;
                });
            }
            , zbx, tzbx,
            {
                AMREX_LOOP_4D(tzbx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fzfab(i,j,k,n) = 0.0;
                });
            }
          );
        } else {
          AMREX_D_TERM(Array4<Real> const fxfab = fluxmf[0].array(mfi);,
                       Array4<Real> const fyfab = fluxmf[1].array(mfi);,
                       Array4<Real> const fzfab = fluxmf[2].array(mfi););
          Array4<Real const> const vfab = mf.const_array(mfi);
          AMREX_D_TERM(Array4<Real const> const etaxfab = etamf[0].const_array(mfi);,
                       Array4<Real const> const etayfab = etamf[1].const_array(mfi);,
                       Array4<Real const> const etazfab = etamf[2].const_array(mfi););
          AMREX_D_TERM(Array4<Real const> const kapxfab = kapmf[0].const_array(mfi);,
                       Array4<Real const> const kapyfab = kapmf[1].const_array(mfi);,
                       Array4<Real const> const kapzfab = kapmf[2].const_array(mfi););

          if (fabtyp == FabType::regular)
          {
              AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
              ( xbx, txbx,
                {
                  mltensor_cross_terms_fx(txbx,fxfab,vfab,etaxfab,kapxfab,dxinv);
                }
                , ybx, tybx,
                {
                  mltensor_cross_terms_fy(tybx,fyfab,vfab,etayfab,kapyfab,dxinv);
                }
                , zbx, tzbx,
                {
                  mltensor_cross_terms_fz(tzbx,fzfab,vfab,etazfab,kapzfab,dxinv);
                }
              );
          }
          else
          {
            AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                         Array4<Real const> const& apy = area[1]->const_array(mfi);,
                         Array4<Real const> const& apz = area[2]->const_array(mfi););
            Array4<EBCellFlag const> const& flag = flags->const_array(mfi);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
            ( xbx, txbx,
              {
                mlebtensor_cross_terms_fx(txbx,fxfab,vfab,etaxfab,kapxfab,apx,flag,dxinv);
              }
              , ybx, tybx,
              {
                mlebtensor_cross_terms_fy(tybx,fyfab,vfab,etayfab,kapyfab,apy,flag,dxinv);
              }
              , zbx, tzbx,
              {
                mlebtensor_cross_terms_fz(tzbx,fzfab,vfab,etazfab,kapzfab,apz,flag,dxinv);
              }
              );
          }
        }
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        fluxmf[idim].FillBoundary(0, AMREX_SPACEDIM, geom.periodicity());
    }
}